

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O2

void secp256k1_ge_to_bytes(uchar *buf,secp256k1_ge *a)

{
  secp256k1_ge_storage s;
  secp256k1_fe y;
  secp256k1_fe x;
  secp256k1_fe_storage local_b8;
  secp256k1_fe_storage local_98;
  secp256k1_fe local_78;
  secp256k1_fe local_48;
  
  local_48.n[0] = (a->x).n[0];
  local_48.n[1] = (a->x).n[1];
  local_48.n[2] = (a->x).n[2];
  local_48.n[3] = (a->x).n[3];
  local_48.n[4] = (a->x).n[4];
  secp256k1_fe_impl_normalize(&local_48);
  local_78.n[4] = (a->y).n[4];
  local_78.n[0] = (a->y).n[0];
  local_78.n[1] = (a->y).n[1];
  local_78.n[2] = (a->y).n[2];
  local_78.n[3] = (a->y).n[3];
  secp256k1_fe_impl_normalize(&local_78);
  secp256k1_fe_impl_to_storage(&local_b8,&local_48);
  secp256k1_fe_impl_to_storage(&local_98,&local_78);
  *(uint64_t *)(buf + 0x30) = local_98.n[2];
  *(uint64_t *)(buf + 0x38) = local_98.n[3];
  *(uint64_t *)(buf + 0x20) = local_98.n[0];
  *(uint64_t *)(buf + 0x28) = local_98.n[1];
  *(uint64_t *)(buf + 0x10) = local_b8.n[2];
  *(uint64_t *)(buf + 0x18) = local_b8.n[3];
  *(uint64_t *)buf = local_b8.n[0];
  *(uint64_t *)(buf + 8) = local_b8.n[1];
  return;
}

Assistant:

static void secp256k1_ge_to_bytes(unsigned char *buf, const secp256k1_ge *a) {
    secp256k1_ge_storage s;

    /* We require that the secp256k1_ge_storage type is exactly 64 bytes.
     * This is formally not guaranteed by the C standard, but should hold on any
     * sane compiler in the real world. */
    STATIC_ASSERT(sizeof(secp256k1_ge_storage) == 64);
    VERIFY_CHECK(!secp256k1_ge_is_infinity(a));
    secp256k1_ge_to_storage(&s, a);
    memcpy(buf, &s, 64);
}